

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_split(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  TextOutputMethod *pp_Var2;
  TextOutputMethod p_Var3;
  bool bVar4;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar5;
  uint uVar6;
  int iVar7;
  Machine *pMVar8;
  undefined4 *puVar9;
  Interpreter *pIVar10;
  long *plVar11;
  undefined8 *puVar12;
  code *pcVar13;
  unsigned_long uVar14;
  _func_int **__s;
  anon_union_8_3_2f476f46_for_data aVar15;
  code *__n;
  long lVar16;
  anon_union_8_3_2f476f46_for_data aVar17;
  code *pcVar18;
  code *pcVar19;
  ValueList result;
  String delim;
  String self;
  undefined1 local_f8 [8];
  long *local_f0;
  undefined1 local_e8 [8];
  anon_union_8_3_2f476f46_for_data local_e0;
  anon_union_8_3_2f476f46_for_data local_d8;
  anon_union_8_3_2f476f46_for_data local_d0;
  anon_union_8_3_2f476f46_for_data local_c8;
  anon_union_8_3_2f476f46_for_data local_c0;
  anon_union_8_3_2f476f46_for_data local_b8;
  anon_union_8_3_2f476f46_for_data local_b0;
  bool local_a8;
  anon_union_8_3_2f476f46_for_data local_a0;
  long *local_98;
  anon_union_8_3_2f476f46_for_data local_90;
  Machine *local_88;
  anon_union_8_3_2f476f46_for_data local_80;
  Machine *local_78;
  anon_union_8_3_2f476f46_for_data local_70;
  undefined1 local_68 [8];
  anon_union_8_3_2f476f46_for_data local_60;
  Value local_58;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_48;
  unsigned_long local_40;
  _func_int **local_38;
  
  local_70.tempNum._0_1_ = false;
  pMVar8 = (Machine *)operator_new(0x30);
  *(long *)&pMVar8->storeImplicit = 1;
  ((RefCountedStorage *)&pMVar8->standardOutput)->_vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  *(Context ***)&pMVar8->yielding = (Context **)0x5;
  (pMVar8->functionType).type = ~Null;
  (pMVar8->functionType).noInvoke = true;
  (pMVar8->functionType).localOnly = ~Off;
  *(undefined5 *)&(pMVar8->functionType).field_0x3 = 0xffffffffff;
  puVar9 = (undefined4 *)operator_new__(5);
  ((SimpleVector<MiniScript::Context_*> *)&pMVar8->interpreter)->mBlockItems = (unsigned_long)puVar9
  ;
  *(undefined1 *)(puVar9 + 1) = 0;
  *puVar9 = 0x666c6573;
  local_78 = pMVar8;
  Context::GetVar((Context *)local_e8,(String *)partialResult.rs,(LocalOnlyMode)&local_78);
  Value::ToString((Value *)&local_b0,(Machine *)local_e8);
  if ((Temp < local_e8[0]) && (local_e0.ref != (RefCountedStorage *)0x0)) {
    plVar11 = &(local_e0.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_e0.ref)->_vptr_RefCountedStorage[1])();
    }
    local_e0.number = 0.0;
  }
  if ((local_78 != (Machine *)0x0) && ((bool)local_70.tempNum._0_1_ == false)) {
    pbVar1 = &local_78->storeImplicit;
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 == 0) {
      (*((RefCountedStorage *)&local_78->standardOutput)->_vptr_RefCountedStorage[1])();
    }
    local_78 = (Machine *)0x0;
  }
  local_80.tempNum._0_1_ = '\0';
  pMVar8 = (Machine *)operator_new(0x30);
  *(undefined8 *)&pMVar8->storeImplicit = 1;
  pMVar8->standardOutput = (TextOutputMethod)&PTR__StringStorage_001d10b0;
  *(undefined8 *)&pMVar8->yielding = 10;
  (pMVar8->functionType).type = ~Null;
  (pMVar8->functionType).noInvoke = true;
  (pMVar8->functionType).localOnly = ~Off;
  *(undefined5 *)&(pMVar8->functionType).field_0x3 = 0xffffffffff;
  pIVar10 = (Interpreter *)operator_new__(10);
  pMVar8->interpreter = pIVar10;
  pIVar10->_vptr_Interpreter = (_func_int **)0x6574696d696c6564;
  *(undefined2 *)&pIVar10->standardOutput = 0x72;
  local_88 = pMVar8;
  Context::GetVar((Context *)local_f8,(String *)partialResult.rs,(LocalOnlyMode)&local_88);
  Value::ToString((Value *)local_e8,(Machine *)local_f8);
  if ((2 < local_f8[0]) && (local_f0 != (long *)0x0)) {
    plVar11 = local_f0 + 1;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (**(code **)(*local_f0 + 8))();
    }
    local_f0 = (long *)0x0;
  }
  if ((local_88 != (Machine *)0x0) && (local_80.tempNum._0_1_ == '\0')) {
    pbVar1 = &local_88->storeImplicit;
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 == 0) {
      (**(code **)(local_88->standardOutput + 8))();
    }
    local_88 = (Machine *)0x0;
  }
  local_90.tempNum._0_1_ = '\0';
  plVar11 = (long *)operator_new(0x30);
  plVar11[1] = 1;
  *plVar11 = (long)&PTR__StringStorage_001d10b0;
  plVar11[3] = 9;
  plVar11[4] = -1;
  puVar12 = (undefined8 *)operator_new__(9);
  plVar11[2] = (long)puVar12;
  *puVar12 = 0x746e756f4378616d;
  *(undefined1 *)(puVar12 + 1) = 0;
  local_98 = plVar11;
  Context::GetVar((Context *)local_68,(String *)partialResult.rs,(LocalOnlyMode)&local_98);
  uVar6 = Value::IntValue((Value *)local_68);
  aVar17._4_4_ = 0;
  aVar17.tempNum = uVar6;
  if ((2 < local_68[0]) &&
     ((ListStorage<MiniScript::Value> *)local_60.ref != (ListStorage<MiniScript::Value> *)0x0)) {
    plVar11 = &(local_60.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*((RefCountedStorage *)&(local_60.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])
                ();
    }
    local_60.number = 0.0;
  }
  if ((local_98 != (long *)0x0) && (local_90.tempNum._0_1_ == '\0')) {
    plVar11 = local_98 + 1;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (**(code **)(*local_98 + 8))();
    }
    local_98 = (long *)0x0;
  }
  local_f8 = (undefined1  [8])0x0;
  local_f0 = (long *)((ulong)local_f0 & 0xffffffffffffff00);
  local_40 = (unsigned_long)(int)(uVar6 - 1);
  pcVar18 = (code *)0x0;
  local_a0 = aVar17;
  local_48 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)context;
  do {
    aVar15 = local_b0;
    if (local_b0.ref == (RefCountedStorage *)0x0) {
      pcVar13 = (code *)0x0;
    }
    else {
      pcVar13 = (code *)(local_b0.ref[1].refCount - 1);
    }
    if (pcVar13 <= pcVar18) {
      Value::Value(&local_58,(ValueList *)local_f8);
      pDVar5 = local_48;
      (local_48->super_RefCountedStorage)._vptr_RefCountedStorage = (_func_int **)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)local_48);
      Value::operator=((Value *)((pDVar5->super_RefCountedStorage)._vptr_RefCountedStorage + 3),
                       &local_58);
      *(undefined1 *)((pDVar5->super_RefCountedStorage)._vptr_RefCountedStorage + 2) = 1;
      if ((2 < local_58.type) && (local_58.data.ref != (RefCountedStorage *)0x0)) {
        plVar11 = &(local_58.data.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_58.data.number = 0.0;
      }
      if ((local_f8 != (undefined1  [8])0x0) && (local_f0._0_1_ == false)) {
        plVar11 = &((RefCountedStorage *)local_f8)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*((RefCountedStorage *)local_f8)->_vptr_RefCountedStorage[1])();
          local_f8 = (undefined1  [8])0x0;
        }
      }
      if ((local_e8 != (undefined1  [8])0x0) && ((bool)local_e0.tempNum._0_1_ == false)) {
        pp_Var2 = (TextOutputMethod *)((long)local_e8 + 8);
        *pp_Var2 = *pp_Var2 + -1;
        if (*pp_Var2 == (TextOutputMethod)0x0) {
          (*(*(_func_int ***)local_e8)[1])();
        }
        local_e8 = (undefined1  [8])0x0;
      }
      if ((local_b0.ref != (RefCountedStorage *)0x0) && (local_a8 == false)) {
        plVar11 = &(local_b0.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_b0.ref)->_vptr_RefCountedStorage[1])();
        }
      }
      return (IntrinsicResult)(IntrinsicResultStorage *)pDVar5;
    }
    if (aVar17.tempNum < 0) {
LAB_00159e7e:
      if ((local_e8 == (undefined1  [8])0x0) ||
         (*(TextOutputMethod *)((long)local_e8 + 0x18) < (TextOutputMethod)0x2)) {
        pcVar13 = pcVar18 + 1;
      }
      else if (local_b0.ref == (RefCountedStorage *)0x0 || local_e8 == (undefined1  [8])0x0) {
        pcVar13 = (code *)(-(ulong)(local_b0.ref == (RefCountedStorage *)0x0) | (ulong)pcVar18);
      }
      else {
        p_Var3 = *(TextOutputMethod *)((long)local_e8 + 0x18);
        lVar16 = local_b0.ref[1].refCount - (long)p_Var3;
        pcVar13 = (code *)0xffffffffffffffff;
        if ((long)pcVar18 <= lVar16) {
          local_d8 = (anon_union_8_3_2f476f46_for_data)
                     ((anon_union_8_3_2f476f46_for_data *)(local_b0.ref + 1))->ref;
          local_38 = *(_func_int ***)((long)local_e8 + 0x10);
          pcVar19 = pcVar18;
          do {
            iVar7 = strncmp((char *)(pcVar19 + (long)&(local_d8.ref)->_vptr_RefCountedStorage),
                            (char *)local_38,(size_t)(p_Var3 + -1));
            aVar17 = local_a0;
            pcVar13 = pcVar19;
            if (iVar7 == 0) break;
            bVar4 = (long)pcVar19 < lVar16;
            pcVar19 = pcVar19 + 1;
            pcVar13 = (code *)0xffffffffffffffff;
          } while (bVar4);
        }
      }
    }
    else {
      if (local_f8 == (undefined1  [8])0x0) {
        uVar14 = 0;
      }
      else {
        uVar14 = ((SimpleVector<MiniScript::TACLine> *)((long)local_f8 + 0x10))->mQtyItems;
      }
      if (uVar14 != local_40) goto LAB_00159e7e;
      if (local_b0.ref == (RefCountedStorage *)0x0) {
        pcVar13 = (code *)0x0;
      }
      else {
        pcVar13 = (code *)(local_b0.ref[1].refCount - 1);
      }
    }
    pcVar19 = (code *)0x0;
    if (-1 < (long)pcVar13) {
      pcVar19 = pcVar13;
    }
    if ((aVar15.ref != (RefCountedStorage *)0x0) && ((long)pcVar13 < 0)) {
      pcVar19 = (code *)(aVar15.ref[1].refCount - 1);
    }
    if (aVar15.ref != (RefCountedStorage *)0x0) {
      pcVar13 = (code *)aVar15.ref[1].refCount;
      if (pcVar18 < pcVar13) {
        __n = pcVar19 + -(long)pcVar18;
        if ((__n == (code *)0xffffffffffffffff) || ((long)(pcVar13 + ~(ulong)pcVar18) < (long)__n))
        {
          __n = pcVar13 + ~(ulong)pcVar18;
        }
        if ((pcVar18 == (code *)0x0) && (__n == pcVar13)) {
          (aVar15.ref)->refCount = (aVar15.ref)->refCount + 1;
        }
        else {
          local_d8.ref = (RefCountedStorage *)operator_new(0x30);
          pcVar13 = __n + 1;
          (local_d8.ref)->refCount = 1;
          (local_d8.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
          local_d8.ref[1].refCount = (long)pcVar13;
          local_d8.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
          __s = (_func_int **)operator_new__((ulong)pcVar13);
          local_d8.ref[1]._vptr_RefCountedStorage = __s;
          memset(__s,0,(size_t)pcVar13);
          memcpy(__s,pcVar18 + (long)aVar15.ref[1]._vptr_RefCountedStorage,(size_t)__n);
          aVar15 = local_d8;
          aVar17 = local_a0;
        }
      }
      else {
        aVar15.number = 0.0;
      }
    }
    local_c0.tempNum._0_2_ = 3;
    local_c0.tempNum._2_1_ = 0;
    local_b8 = aVar15;
    if (aVar15.ref == (RefCountedStorage *)0x0) {
      local_b8 = DAT_001d3308;
    }
    if (local_b8.ref != (RefCountedStorage *)0x0) {
      (local_b8.ref)->refCount = (local_b8.ref)->refCount + 1;
    }
    List<MiniScript::Value>::Add((List<MiniScript::Value> *)local_f8,(Value *)&local_c0);
    if ((2 < (byte)local_c0.tempNum._0_1_) && (local_b8.ref != (RefCountedStorage *)0x0)) {
      plVar11 = &(local_b8.ref)->refCount;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (*(local_b8.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b8.number = 0.0;
    }
    if (aVar15.ref != (RefCountedStorage *)0x0) {
      plVar11 = &(aVar15.ref)->refCount;
      *plVar11 = *plVar11 + -1;
      if (*plVar11 == 0) {
        (*(aVar15.ref)->_vptr_RefCountedStorage[1])(aVar15.number);
      }
    }
    if (local_e8 == (undefined1  [8])0x0) {
      pcVar18 = (code *)0x0;
    }
    else {
      pcVar18 = *(TextOutputMethod *)((long)local_e8 + 0x18) + -1;
    }
    if (local_b0.ref == (RefCountedStorage *)0x0) {
      pcVar13 = (code *)0x0;
    }
    else {
      pcVar13 = (code *)(local_b0.ref[1].refCount - 1);
    }
    pcVar18 = pcVar18 + (long)pcVar19;
    if (((local_e8 != (undefined1  [8])0x0) && (pcVar18 == pcVar13)) &&
       ((TextOutputMethod)0x1 < *(TextOutputMethod *)((long)local_e8 + 0x18))) {
      local_d0.tempNum._0_1_ = Value::emptyString;
      local_d0.tempNum._1_2_ = _DAT_001d3301;
      local_c8 = DAT_001d3308;
      if ((2 < Value::emptyString) && (DAT_001d3308.ref != (RefCountedStorage *)0x0)) {
        (DAT_001d3308.ref)->refCount = (DAT_001d3308.ref)->refCount + 1;
      }
      List<MiniScript::Value>::Add((List<MiniScript::Value> *)local_f8,(Value *)&local_d0);
      if ((2 < (byte)local_d0.tempNum._0_1_) && (local_c8.ref != (RefCountedStorage *)0x0)) {
        plVar11 = &(local_c8.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_c8.ref)->_vptr_RefCountedStorage[1])();
        }
        local_c8.number = 0.0;
      }
    }
  } while( true );
}

Assistant:

static IntrinsicResult intrinsic_split(Context *context, IntrinsicResult partialResult) {
		String self = context->GetVar("self").ToString();
		String delim = context->GetVar("delimiter").ToString();
		long maxCount = context->GetVar("maxCount").IntValue();
		ValueList result;
		long posB = 0;
		while (posB < self.LengthB()) {
			long nextPos;
			if (maxCount >= 0 and result.Count() == maxCount - 1) nextPos = self.LengthB();
			else if (delim.empty()) nextPos = posB + 1;
			else nextPos = self.IndexOfB(delim, posB);
			if (nextPos < 0) nextPos = self.LengthB();
			result.Add(self.SubstringB(posB, nextPos - posB));
			posB = nextPos + delim.LengthB();
			if (posB == self.LengthB() && !delim.empty()) result.Add(Value::emptyString);
		}
		return IntrinsicResult(result);
	}